

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_table_add(flatcc_builder_t *B,int id,size_t size,uint16_t align)

{
  int iVar1;
  uint uVar2;
  flatbuffers_voffset_t *pfVar3;
  uint uVar4;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x712,"void *flatcc_builder_table_add(flatcc_builder_t *, int, size_t, uint16_t)"
                 );
  }
  if ((uint)id < 0x7ffd) {
    if (B->align < align) {
      B->align = align;
    }
    pfVar3 = B->vs;
    if (pfVar3[(uint)id] == 0) {
      B->vt_hash = ((B->vt_hash ^ id) * -0x61c8864f ^ (uint)size) * -0x61c8864f;
      uVar4 = -(uint)align & (B->ds_offset + (uint)align) - 1;
      uVar2 = (uint)size + uVar4;
      B->ds_offset = uVar2;
      if (B->ds_limit <= uVar2) {
        iVar1 = reserve_ds(B,(ulong)(uVar2 + 1),0xfffc);
        if (iVar1 != 0) {
          return (void *)0x0;
        }
        pfVar3 = B->vs;
      }
      pfVar3[(uint)id] = (short)uVar4 + 4;
      if (B->id_end <= (ushort)id) {
        B->id_end = (ushort)id + 1;
      }
      return B->ds + uVar4;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x71d,"void *flatcc_builder_table_add(flatcc_builder_t *, int, size_t, uint16_t)"
                 );
  }
  __assert_fail("id >= 0 && id <= (int)((65535) / sizeof(flatbuffers_voffset_t) - 3)",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x713,"void *flatcc_builder_table_add(flatcc_builder_t *, int, size_t, uint16_t)");
}

Assistant:

void *flatcc_builder_table_add(flatcc_builder_t *B, int id, size_t size, uint16_t align)
{
    /*
     * We align the offset relative to the first table field, excluding
     * the header holding the vtable reference. On the stack, `ds_first`
     * is aligned to 8 bytes thanks to the `enter_frame` logic, and this
     * provides a safe way to update the fields on the stack, but here
     * we are concerned with the target buffer alignment.
     *
     * We could also have aligned relative to the end of the table which
     * would allow us to emit each field immediately, but it would be a
     * confusing user experience wrt. field ordering, and it would add
     * more variability to vtable layouts, thus reducing reuse, and
     * frequent emissions to external emitter interface would be
     * sub-optimal. Also, with that appoach, the vtable offsets would
     * have to be adjusted at table end.
     *
     * As we have it, each emit occur at table end, vector end, string
     * end, or buffer end, which might be helpful to various backend
     * processors.
     */
    check(frame(type) == flatcc_builder_table, "expected table frame");
    check(id >= 0 && id <= (int)FLATBUFFERS_ID_MAX, "table id out of range");
    if (align > B->align) {
        B->align = align;
    }
#if FLATCC_BUILDER_ALLOW_REPEAT_TABLE_ADD
    if (B->vs[id] != 0) {
        return B->ds + B->vs[id] - field_size;
    }
#else
    if (B->vs[id] != 0) {
        check(0, "table field already set");
        return 0;
    }
#endif
    FLATCC_BUILDER_UPDATE_VT_HASH(B->vt_hash, (uint32_t)id, (uint32_t)size);
    return push_ds_field(B, (uoffset_t)size, align, (voffset_t)id);
}